

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collectives.cpp
# Opt level: O0

request diy::mpi::detail::iall_reduce
                  (communicator *comm,void *dataIn,void *dataOut,int count,datatype *type,
                  operation *op)

{
  MPI_Datatype poVar1;
  MPI_Op poVar2;
  MPI_Comm poVar3;
  MPI_Datatype *ppoVar4;
  MPI_Op *ppoVar5;
  MPI_Comm *ppoVar6;
  MPI_Request *ppoVar7;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  communicator *in_RDI;
  DIY_MPI_Datatype *in_R8;
  DIY_MPI_Op *in_R9;
  request r;
  DIY_MPI_Comm local_40;
  DIY_MPI_Op *local_38;
  DIY_MPI_Datatype *local_30;
  undefined4 local_24;
  undefined8 local_20;
  undefined8 local_18;
  communicator *local_10;
  DIY_MPI_Request local_8;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  request::request((request *)&local_8);
  ppoVar4 = mpi_cast(local_30);
  poVar1 = *ppoVar4;
  ppoVar5 = mpi_cast(local_38);
  poVar2 = *ppoVar5;
  local_40 = communicator::handle(local_10);
  ppoVar6 = mpi_cast(&local_40);
  poVar3 = *ppoVar6;
  ppoVar7 = mpi_cast(&local_8);
  MPI_Iallreduce(local_18,local_20,local_24,poVar1,poVar2,poVar3,ppoVar7);
  return (request)(DIY_MPI_Request)local_8.data;
}

Assistant:

request iall_reduce(const communicator& comm,
                    const void* dataIn, void* dataOut, int count, const datatype& type,
                    const operation& op)
{
  request r;
#if DIY_HAS_MPI
  MPI_Iallreduce(dataIn, dataOut, count, mpi_cast(type.handle), mpi_cast(op.handle), mpi_cast(comm.handle()), &mpi_cast(r.handle));
#else
  copy_buffer(dataIn, dataOut, mpi_cast(type.handle), count);
  (void)comm; (void)op;
#endif
  return r;
}